

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RCStrUnref(void *z)

{
  ulong *puVar1;
  long in_RDI;
  RCStr *p;
  
  puVar1 = (ulong *)(in_RDI + -8);
  if (*puVar1 < 2) {
    sqlite3_free((void *)0x171a8b);
  }
  else {
    *puVar1 = *puVar1 - 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RCStrUnref(void *z){
  RCStr *p = (RCStr*)z;
  assert( p!=0 );
  p--;
  assert( p->nRCRef>0 );
  if( p->nRCRef>=2 ){
    p->nRCRef--;
  }else{
    sqlite3_free(p);
  }
}